

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
link_data_nodes(Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                *this,data_node_type *old_leaf,data_node_type *left_leaf,data_node_type *right_leaf)

{
  self_type *psVar1;
  
  psVar1 = old_leaf->prev_leaf_;
  if (psVar1 != (self_type *)0x0) {
    psVar1->next_leaf_ = left_leaf;
  }
  left_leaf->prev_leaf_ = psVar1;
  left_leaf->next_leaf_ = right_leaf;
  right_leaf->prev_leaf_ = left_leaf;
  psVar1 = old_leaf->next_leaf_;
  right_leaf->next_leaf_ = psVar1;
  if (psVar1 != (self_type *)0x0) {
    psVar1->prev_leaf_ = right_leaf;
  }
  return;
}

Assistant:

void link_data_nodes(const data_node_type* old_leaf,
                       data_node_type* left_leaf, data_node_type* right_leaf) {
    if (old_leaf->prev_leaf_ != nullptr) {
      old_leaf->prev_leaf_->next_leaf_ = left_leaf;
    }
    left_leaf->prev_leaf_ = old_leaf->prev_leaf_;
    left_leaf->next_leaf_ = right_leaf;
    right_leaf->prev_leaf_ = left_leaf;
    right_leaf->next_leaf_ = old_leaf->next_leaf_;
    if (old_leaf->next_leaf_ != nullptr) {
      old_leaf->next_leaf_->prev_leaf_ = right_leaf;
    }
  }